

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.c
# Opt level: O0

_Bool testbufferedxor8(size_t size)

{
  _Bool _Var1;
  void *__ptr;
  clock_t cVar2;
  clock_t cVar3;
  ulong in_RDI;
  double time_taken;
  clock_t t;
  size_t times;
  _Bool constructed;
  size_t i;
  uint64_t *big_set;
  xor8_t filter;
  xor8_t *in_stack_000001e8;
  uint32_t in_stack_000001f4;
  uint64_t *in_stack_000001f8;
  xor8_t *in_stack_ffffffffffffffa8;
  uint32_t in_stack_ffffffffffffffb0;
  ulong local_48;
  ulong local_38;
  _Bool local_1;
  
  printf("testing buffered xor8 ");
  printf("size = %zu \n",in_RDI);
  xor8_allocate(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  __ptr = malloc(in_RDI << 3);
  for (local_38 = 0; local_38 < in_RDI; local_38 = local_38 + 1) {
    *(ulong *)((long)__ptr + local_38 * 8) = local_38;
  }
  _Var1 = xor8_buffered_populate(in_stack_000001f8,in_stack_000001f4,in_stack_000001e8);
  if (_Var1) {
    for (local_48 = 0; local_48 < 5; local_48 = local_48 + 1) {
      cVar2 = clock();
      xor8_buffered_populate(in_stack_000001f8,in_stack_000001f4,in_stack_000001e8);
      cVar3 = clock();
      printf("It took %f seconds to build an index over %zu values. \n",
             (double)(cVar3 - cVar2) / 1000000.0,in_RDI);
    }
    xor8_free((xor8_t *)0x10266d);
    free(__ptr);
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool testbufferedxor8(size_t size) {
  printf("testing buffered xor8 ");
  printf("size = %zu \n", size);

  xor8_t filter;
  xor8_allocate((uint32_t)size, &filter);
  // we need some set of values
  uint64_t *big_set = (uint64_t *)malloc(sizeof(uint64_t) * size);
  for (size_t i = 0; i < size; i++) {
    big_set[i] = i; // we use contiguous values
  }
  // we construct the filter
  bool constructed = xor8_buffered_populate(big_set, (uint32_t)size, &filter); // warm the cache
  if(!constructed) { return false; }
  for (size_t times = 0; times < 5; times++) {
    clock_t t;
    t = clock();
    xor8_buffered_populate(big_set, (uint32_t)size, &filter);
    t = clock() - t;
    double time_taken = ((double)t) / CLOCKS_PER_SEC; // in seconds
    printf("It took %f seconds to build an index over %zu values. \n",
           time_taken, size);
  }
  xor8_free(&filter);
  free(big_set);
  return true;
}